

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamDecoder.cpp
# Opt level: O2

void scan_bitstream_mfm_fm(TrackData *trackdata)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  BitBuffer *this;
  uchar uVar4;
  undefined8 uVar5;
  pointer pDVar6;
  pointer pSVar7;
  pointer ppVar8;
  Sector *pSVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  bool bVar14;
  uint16_t uVar15;
  int iVar16;
  Encoding EVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  BitBuffer *pBVar23;
  Encoding *t;
  LogHelper *pLVar24;
  Sector *pSVar25;
  int iVar26;
  long lVar27;
  ushort uVar28;
  ulong uVar29;
  EVP_PKEY_CTX *ctx;
  uint uVar30;
  uint8_t uVar31;
  pointer ppVar32;
  uint8_t uVar33;
  Sector *this_00;
  pointer ppVar34;
  pointer ppVar35;
  uint uVar36;
  bool bVar37;
  CRC16 crc;
  uint8_t am;
  uint16_t local_19e;
  int am_offset;
  int local_198;
  char local_191;
  BitBuffer *local_190;
  array<unsigned_char,_6UL> id;
  Header header;
  Sector s;
  Track track;
  vector<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_> data_fields;
  _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
  local_90;
  _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
  local_60;
  
  Track::Track(&track,0);
  bVar37 = opt.a1sync == 0;
  pBVar23 = TrackData::bitstream(trackdata);
  BitBuffer::seek(pBVar23,0);
  track.tracklen = BitBuffer::track_bitsize(pBVar23);
  CRC16::CRC16(&crc,0xffff);
  uVar36 = -(uint)bVar37 | 0xffdfffdf;
  data_fields.
  super__Vector_base<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data_fields.
  super__Vector_base<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data_fields.
  super__Vector_base<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  t = &pBVar23->encoding;
  uVar30 = 0;
  local_190 = pBVar23;
  uVar31 = '\0';
LAB_0014932e:
  do {
    bVar37 = BitBuffer::wrapped(pBVar23);
    pSVar9 = track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((bVar37) ||
       ((iVar16 = Track::size(&track), iVar16 == 0 &&
        (iVar16 = BitBuffer::tell(pBVar23),
        pSVar9 = track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                 super__Vector_impl_data._M_start, track.tracklen < iVar16)))) {
LAB_001498e1:
      do {
        this_00 = pSVar9;
        pSVar7 = track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (this_00 ==
            track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          TrackData::add(trackdata,&track);
          std::_Vector_base<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>::
          ~_Vector_base(&data_fields.
                         super__Vector_base<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>
                       );
          std::vector<Sector,_std::allocator<Sector>_>::~vector(&track.m_sectors);
          return;
        }
        bVar10 = this_00->encoding == FM | 4;
        iVar16 = (7 << bVar10) + 0x290;
        if (this_00->datarate != _1M) {
          iVar16 = (7 << bVar10) + 0x160;
        }
        bVar37 = Sector::has_badidcrc(this_00);
        pSVar9 = this_00 + 1;
      } while (bVar37);
      if (opt.debug != 0) {
        pLVar24 = util::operator<<((LogHelper *)&util::cout,(char (*) [22])"  s_b_mfm_fm finding ");
        pLVar24 = util::operator<<(pLVar24,&trackdata->cylhead);
        pLVar24 = util::operator<<(pLVar24,(char (*) [9])0x1abda3);
        pLVar24 = util::operator<<(pLVar24,&(this_00->header).sector);
        util::operator<<(pLVar24,(char (*) [3])0x1a83d9);
      }
      local_191 = pSVar9 != pSVar7;
      ppVar35 = data_fields.
                super__Vector_base<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
LAB_001499c6:
      do {
        do {
          do {
            ppVar34 = ppVar35;
            ppVar8 = data_fields.
                     super__Vector_base<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            ppVar32 = data_fields.
                      super__Vector_base<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (ppVar34 ==
                data_fields.
                super__Vector_base<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) goto LAB_001498e1;
            ppVar35 = ppVar34 + 1;
          } while (ppVar34->second != this_00->encoding);
          iVar18 = BitBuffer::track_offset(local_190,ppVar34->first);
          pBVar23 = local_190;
          iVar19 = 0;
          if (iVar18 < this_00->offset) {
            iVar19 = track.tracklen;
          }
          iVar19 = iVar19 + (iVar18 - this_00->offset);
        } while ((iVar19 < iVar16) || (iVar16 + 0x170 < iVar19));
        ppVar35 = ppVar34 + 1;
        if (ppVar35 != ppVar8) {
          ppVar32 = ppVar35;
        }
        BitBuffer::seek(local_190,ppVar34->first);
        pBVar23->encoding = ppVar34->second;
        bVar11 = BitBuffer::read_byte(pBVar23);
        ctx = (EVP_PKEY_CTX *)0xffff;
        if (ppVar34->second == MFM) {
          ctx = (EVP_PKEY_CTX *)0xcdb4;
        }
        CRC16::init(&crc,ctx);
        CRC16::add(&crc,(uint)bVar11);
        if ((bVar11 == 0xfd) && (ppVar34->second == FM)) {
          this_00->encoding = RX02;
          piVar1 = &(this_00->header).size;
          *piVar1 = *piVar1 + 1;
          *t = MFM;
          bVar10 = 4;
        }
        pSVar25 = pSVar9;
        if (pSVar9 == pSVar7) {
          pSVar25 = track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
        iVar20 = 0;
        iVar26 = pSVar25->offset - iVar18;
        iVar19 = 0;
        if (iVar26 == 0 || pSVar25->offset < iVar18) {
          iVar19 = track.tracklen;
        }
        uVar30 = iVar26 + iVar19;
        iVar26 = (int)uVar30 >> bVar10;
        iVar19 = ppVar32->first;
        iVar18 = ppVar34->first;
        if (iVar19 <= iVar18) {
          iVar20 = BitBuffer::size(local_190);
          iVar18 = ppVar34->first;
        }
        lVar27 = (long)iVar26 + -1;
        iVar21 = (int)lVar27;
        iVar19 = ((iVar20 + iVar19) - iVar18 >> bVar10) + -1;
        if (opt.gap2 == 0) {
          iVar19 = iVar21;
        }
        if (pSVar9 == pSVar7) {
          iVar19 = iVar21;
        }
        iVar18 = iVar19 + -3;
        if (this_00->encoding != MFM) {
          iVar18 = iVar19;
        }
        if (iVar19 < 3) {
          iVar18 = iVar19;
        }
        local_198 = Sector::size(this_00);
        local_198 = local_198 + 2;
        iVar19 = iVar18;
        if (iVar18 < local_198) {
          iVar19 = local_198;
        }
        iVar20 = BitBuffer::remaining(local_190);
        if (iVar20 >> bVar10 < local_198) {
          iVar22 = Sector::copies(this_00);
          if ((iVar22 != 0) &&
             (bVar37 = Sector::is_8k_sector(this_00), iVar20 >> bVar10 < 0x1802 || !bVar37)) {
            if (opt.debug != 0) {
              util::operator<<((LogHelper *)&util::cout,
                               (char (*) [45])"  s_b_mfm_fm ignoring truncated sector copy\n");
            }
            goto LAB_001499c6;
          }
          if (opt.debug != 0) {
            util::operator<<((LogHelper *)&util::cout,
                             (char (*) [55])
                             "  s_b_mfm_fm using truncated sector data as only copy\n");
          }
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&header,(long)iVar19,
                   (allocator_type *)&s);
        BitBuffer::read<Data>(local_190,(Data *)&header);
        local_19e = CRC16::add(&crc,(void *)header._0_8_,(long)local_198);
        if ((local_19e != 0) && (opt.debug != 0)) {
          iVar19 = Sector::size(this_00);
          bVar2 = *(byte *)(header._0_8_ + (long)iVar19);
          iVar19 = Sector::size(this_00);
          bVar3 = *(byte *)(header._0_8_ + 1 + (long)iVar19);
          bVar12 = CRC16::msb(&crc);
          bVar13 = CRC16::lsb(&crc);
          util::fmt_abi_cxx11_
                    ((string *)&s,"  s_b_mfm_fm bad data CRC: %02X %02X, expected %02X %02X\n",
                     (ulong)bVar2,(ulong)bVar3,(ulong)bVar12,(ulong)bVar13);
          util::operator<<((LogHelper *)&util::cout,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s);
          std::__cxx11::string::~string((string *)&s);
        }
        if ((opt.keepoverlap == 0) && (iVar19 = Sector::size(this_00), iVar18 < iVar19)) {
LAB_00149d19:
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&header,(long)iVar18);
        }
        else {
          iVar19 = header.sector;
          uVar5 = header._0_8_;
          iVar18 = Sector::size(this_00);
          if ((iVar18 < iVar19 - (int)uVar5) &&
             ((opt.gaps == 0 || ((pSVar9 == pSVar7 && (opt.gap4b == 0)))))) {
            iVar18 = Sector::size(this_00);
            goto LAB_00149d19;
          }
        }
        iVar26 = iVar26 + 6;
        iVar19 = header.sector - header.cyl;
        if (iVar19 < iVar26) {
          bVar37 = false;
        }
        else {
          bVar37 = true;
          if (((uVar30 & ~(-1 << bVar10)) == 0) && (*(char *)(header._0_8_ + lVar27) == -2)) {
            bVar37 = test_remove_gap2((Data *)&header,iVar26);
          }
        }
        if (iVar19 < local_198) {
          bVar14 = false;
        }
        else if (pSVar9 == pSVar7) {
          bVar14 = test_remove_gap4b((Data *)&header,local_198);
        }
        else {
          bVar14 = test_remove_gap3((Data *)&header,local_198,&this_00->gap3);
        }
        if (opt.gaps != 2) {
          if ((iVar26 <= iVar19 & bVar37) == 1) {
            if (opt.debug != 0) {
              util::operator<<((LogHelper *)&util::cout,
                               (char (*) [33])"  s_b_mfm_fm removing gap2 data\n");
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&header,
                       (long)(int)(iVar21 + -3 + (uint)(this_00->encoding != MFM) * 3));
          }
          else if (opt.debug != 0 && iVar26 <= iVar19) {
            util::operator<<((LogHelper *)&util::cout,
                             (char (*) [36])"  s_b_mfm_fm skipping gap2 removal\n");
          }
          if ((local_198 <= iVar19) && (((bVar37 | iVar19 < iVar26) & bVar14) != 0)) {
            if (pSVar9 == pSVar7) {
              if (opt.debug != 0) {
                util::operator<<((LogHelper *)&util::cout,
                                 (char (*) [34])"  s_b_mfm_fm removing gap4b data\n");
              }
            }
            else if (opt.debug != 0) {
              util::operator<<((LogHelper *)&util::cout,
                               (char (*) [33])"  s_b_mfm_fm removing gap3 data\n");
            }
            iVar19 = Sector::size(this_00);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&header,(long)iVar19
                      );
          }
        }
        s.header.sector = 0;
        s.datarate = Unknown;
        s.encoding = Unknown;
        s._24_8_ = &s.header.sector;
        s.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        s._32_8_ = s._24_8_;
        bVar37 = Sector::is_8k_sector(this_00);
        if (bVar37) {
          ChecksumMethods((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                           *)&local_90,(uint8_t *)header._0_8_,header.sector - header.cyl);
          std::
          _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
          ::operator=((_Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                       *)&s,&local_90);
          std::
          _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
          ::~_Rb_tree(&local_90);
          if (opt.debug != 0) {
            pLVar24 = util::operator<<((LogHelper *)&util::cout,
                                       (char (*) [29])"  s_b_mfm_fm chk8k_method = ");
            std::
            _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
            ::_Rb_tree(&local_60,
                       (_Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                        *)&s);
            ChecksumName_abi_cxx11_
                      ((string *)&local_90,
                       (set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)
                       &local_60);
            pLVar24 = util::operator<<(pLVar24,(string *)&local_90);
            id._M_elems[0] = '\n';
            util::operator<<(pLVar24,(char *)&id);
            std::__cxx11::string::~string((string *)&local_90);
            std::
            _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
            ::~_Rb_tree(&local_60);
          }
        }
        if ((local_19e == 0 && local_191 == '\0') &&
           (iVar19 = BitBuffer::track_offset(local_190,(local_198 << bVar10) + ppVar34->first),
           iVar19 < ppVar34->first)) {
          iVar18 = BitBuffer::splicepos(local_190);
          if (iVar18 < iVar19) {
            iVar18 = iVar19;
          }
          BitBuffer::splicepos(local_190,iVar18);
        }
        Sector::add(this_00,(Data *)&header,local_19e != 0,bVar11);
        pDVar6 = s.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                 super__Vector_impl_data._M_start;
        std::
        _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
        ::~_Rb_tree((_Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                     *)&s);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&header);
        if ((local_19e == 0) || (pDVar6 != (pointer)0x0)) goto LAB_001498e1;
      } while( true );
    }
    bVar10 = BitBuffer::read1(pBVar23);
    uVar30 = (uint)bVar10 | uVar30 * 2;
    if ((uVar30 & uVar36) != 0x44894489) goto LAB_0014939f;
    uVar15 = BitBuffer::read16(pBVar23);
  } while ((uVar15 & uVar36) != 0x4489);
  uVar28 = 0xcdb4;
  EVar17 = MFM;
  goto LAB_0014940d;
LAB_0014939f:
  if ((opt.encoding != MFM) &&
     ((((uVar30 + 0x55ddd778 < 0x23 &&
        ((0x500000005U >> ((ulong)(uVar30 + 0x55ddd778) & 0x3f) & 1) != 0)) ||
       (uVar30 == 0xaa222a8a)) || ((uVar30 == 0xaa2a2a88 || (uVar30 == 0xaa222aa8)))))) {
    iVar16 = BitBuffer::tell(pBVar23);
    uVar28 = 0xffff;
    BitBuffer::seek(local_190,iVar16 + -0x20);
    EVar17 = FM;
LAB_0014940d:
    *t = EVar17;
    CRC16::init(&crc,(EVP_PKEY_CTX *)(ulong)uVar28);
    pBVar23 = local_190;
    am_offset = BitBuffer::tell(local_190);
    am = BitBuffer::read_byte(pBVar23);
    CRC16::add(&crc,(uint)am);
    this = local_190;
    pBVar23 = local_190;
    switch(am) {
    case 0xf8:
    case 0xf9:
    case 0xfa:
    case 0xfb:
    case 0xfd:
      EVar17 = *t;
      uVar33 = uVar31;
      if ((EVar17 != FM) || (uVar33 = am, uVar31 == 0xfe)) {
        if (opt.debug != 0) {
          pLVar24 = util::operator<<((LogHelper *)&util::cout,(char (*) [12])"s_b_mfm_fm ");
          pLVar24 = util::operator<<(pLVar24,t);
          pLVar24 = util::operator<<(pLVar24,(char (*) [10])0x1a66a1);
          pLVar24 = util::operator<<(pLVar24,&am);
          pLVar24 = util::operator<<(pLVar24,(char (*) [13])") at offset ");
          pLVar24 = util::operator<<(pLVar24,&am_offset);
          pLVar24 = util::operator<<(pLVar24,(char (*) [3])0x1a93a4);
          iVar16 = BitBuffer::track_offset(local_190,am_offset);
          s.header.cyl = iVar16;
          pLVar24 = util::operator<<(pLVar24,(int *)&s);
          util::operator<<(pLVar24,(char (*) [3])0x1aa504);
          EVar17 = *t;
        }
        s.header.head = EVar17;
        s.header.cyl = am_offset;
        std::vector<std::pair<int,Encoding>,std::allocator<std::pair<int,Encoding>>>::
        emplace_back<std::pair<int,Encoding>>
                  ((vector<std::pair<int,Encoding>,std::allocator<std::pair<int,Encoding>>> *)
                   &data_fields,(pair<int,_Encoding> *)&s);
        pBVar23 = local_190;
        uVar31 = uVar33;
      }
      break;
    case 0xfc:
      if (opt.debug != 0) {
        pLVar24 = util::operator<<((LogHelper *)&util::cout,(char (*) [12])"s_b_mfm_fm ");
        pLVar24 = util::operator<<(pLVar24,t);
        pLVar24 = util::operator<<(pLVar24,(char (*) [16])" IAM at offset ");
        pLVar24 = util::operator<<(pLVar24,&am_offset);
        pLVar24 = util::operator<<(pLVar24,(char (*) [3])0x1a93a4);
        iVar16 = BitBuffer::track_offset(local_190,am_offset);
        s.header.cyl = iVar16;
        pLVar24 = util::operator<<(pLVar24,(int *)&s);
        util::operator<<(pLVar24,(char (*) [3])0x1aa504);
        pBVar23 = local_190;
      }
      break;
    case 0xfe:
      BitBuffer::read<std::array<unsigned_char,6ul>>(local_190,&id);
      CRC16::add(&crc,&id,6);
      uVar15 = CRC16::operator_cast_to_unsigned_short(&crc);
      if ((uVar15 == 0) || ((pBVar23 = local_190, opt.idcrc == 1 && (*t != FM)))) {
        Header::Header(&header,(uint)id._M_elems[0],(uint)id._M_elems[1],(uint)id._M_elems[2],
                       (uint)id._M_elems[3]);
        Sector::Sector(&s,this->datarate,this->encoding,&header,0);
        uVar15 = CRC16::operator_cast_to_unsigned_short(&crc);
        Sector::set_badidcrc(&s,uVar15 != 0);
        iVar16 = BitBuffer::track_offset(this,am_offset);
        s.offset = iVar16;
        if (opt.debug != 0) {
          pLVar24 = util::operator<<((LogHelper *)&util::cout,(char (*) [12])"s_b_mfm_fm ");
          pLVar24 = util::operator<<(pLVar24,t);
          pLVar24 = util::operator<<(pLVar24,(char (*) [11])0x1a64ad);
          pLVar24 = util::operator<<(pLVar24,&header.sector);
          pLVar24 = util::operator<<(pLVar24,(char (*) [13])") at offset ");
          pLVar24 = util::operator<<(pLVar24,&am_offset);
          pLVar24 = util::operator<<(pLVar24,(char (*) [3])0x1a93a4);
          pLVar24 = util::operator<<(pLVar24,&s.offset);
          util::operator<<(pLVar24,(char (*) [3])0x1aa504);
        }
        Track::add(&track,&s);
        if ((opt.debug != 0) &&
           (uVar15 = CRC16::operator_cast_to_unsigned_short(&crc), uVar4 = id._M_elems[4],
           uVar15 != 0)) {
          uVar29 = (ulong)id._M_elems[5];
          bVar10 = CRC16::msb(&crc);
          bVar11 = CRC16::lsb(&crc);
          util::fmt_abi_cxx11_
                    ((string *)&local_90,"  s_b_mfm_fm bad id CRC: %02X %02X, expected %02X %02X\n",
                     (ulong)uVar4,uVar29,(ulong)bVar10,(ulong)bVar11);
          util::operator<<((LogHelper *)&util::cout,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_90);
          std::__cxx11::string::~string((string *)&local_90);
        }
        uVar33 = am;
        if (*t != FM) {
          uVar33 = uVar31;
        }
        std::vector<Data,_std::allocator<Data>_>::~vector(&s.m_data);
        pBVar23 = local_190;
        uVar31 = uVar33;
      }
      break;
    default:
      if (opt.debug != 0) {
        pLVar24 = util::operator<<((LogHelper *)&util::cout,(char (*) [20])"s_b_mfm_fm unknown ");
        pLVar24 = util::operator<<(pLVar24,t);
        pLVar24 = util::operator<<(pLVar24,(char (*) [6])0x1a93a1);
        pLVar24 = util::operator<<(pLVar24,std::hex);
        pLVar24 = util::operator<<(pLVar24,&am);
        pLVar24 = util::operator<<(pLVar24,std::dec);
        pLVar24 = util::operator<<(pLVar24,(char (*) [13])") at offset ");
        pLVar24 = util::operator<<(pLVar24,&am_offset);
        pLVar24 = util::operator<<(pLVar24,(char (*) [5])0x1ac9bb);
        pLVar24 = util::operator<<(pLVar24,&trackdata->cylhead);
        util::operator<<(pLVar24,(char (*) [2])0x1a83c6);
        pBVar23 = local_190;
      }
    }
  }
  goto LAB_0014932e;
}

Assistant:

void scan_bitstream_mfm_fm(TrackData& trackdata)
{
    Track track;
    uint32_t sync_mask = opt.a1sync ? 0xffdfffdf : 0xffffffff;

    auto& bitbuf = trackdata.bitstream();
    bitbuf.seek(0);
    track.tracklen = bitbuf.track_bitsize();

    CRC16 crc;
    std::vector<std::pair<int, Encoding>> data_fields;

    uint32_t dword = 0;
    uint8_t last_fm_am = 0;

    while (!bitbuf.wrapped())
    {
        // Give up if no headers were found in the first revolution
        if (!track.size() && bitbuf.tell() > track.tracklen)
            break;

        dword = (dword << 1) | bitbuf.read1();

        if ((dword & sync_mask) == 0x44894489)
        {
            if ((bitbuf.read16() & sync_mask) != 0x4489) continue;

            bitbuf.encoding = Encoding::MFM;
            crc.init(CRC16::A1A1A1);
        }
        else if (opt.encoding == Encoding::MFM) // FM disabled?
            continue;
        else
        {
            // Check for known FM address marks
            switch (dword)
            {
            case 0xaa222888:    // F8/C7 DDAM
            case 0xaa22288a:    // F9/C7 Alt-DDAM
            case 0xaa2228a8:    // FA/C7 Alt-DAM
            case 0xaa2228aa:    // FB/C7 DAM
            case 0xaa2a2a88:    // FC/D7 IAM
            case 0xaa222a8a:    // FD/C7 RX02 DAM
            case 0xaa222aa8:    // FE/C7 IDAM
                break;

                // Not a recognised FM mark, so keep searching
            default:
                continue;
            }

            // With FM the address mark is also the sync, so step back to read it again
            bitbuf.seek(bitbuf.tell() - 32);

            bitbuf.encoding = Encoding::FM;
            crc.init();
        }

        auto am_offset = bitbuf.tell();
        auto am = bitbuf.read_byte();
        crc.add(am);

        switch (am)
        {
        case 0xfe:  // IDAM
        {
            std::array<uint8_t, 6> id;  // CHRN + 16-bit CRC
            bitbuf.read(id);

            // Check header CRC, skipping if it's bad, unless the user wants it.
            // Don't allow FM sectors with ID CRC errors, due to the false-positive risk.
            crc.add(id.data(), id.size());
            if (!crc || (opt.idcrc == 1 && bitbuf.encoding != Encoding::FM))
            {
                Header header(id[0], id[1], id[2], id[3]);
                Sector s(bitbuf.datarate, bitbuf.encoding, header);
                s.set_badidcrc(crc != 0);
                s.offset = bitbuf.track_offset(am_offset);

                if (opt.debug)
                    util::cout << "s_b_mfm_fm " << bitbuf.encoding << " IDAM (id=" << header.sector << ") at offset " << am_offset << " (" << s.offset << ")\n";
                track.add(std::move(s));

                if (opt.debug && crc != 0)
                {
                    util::cout << util::fmt("  s_b_mfm_fm bad id CRC: %02X %02X, expected %02X %02X\n",
                        id[4], id[5], crc.msb(), crc.lsb());
                }

                if (bitbuf.encoding == Encoding::FM)
                    last_fm_am = am;
            }
            break;
        }

        case 0xfb: case 0xfa:   // normal data (+alt)
        case 0xf8: case 0xf9:   // deleted data (+alt)
        case 0xfd:              // RX02
        {
            // FM address marks are short, so false positives are likely.
            if (bitbuf.encoding == Encoding::FM)
            {
                // Require a valid FM IDAM before we accept an FM DAM.
                if (last_fm_am != 0xfe)
                    break;

                last_fm_am = am;
            }

            if (opt.debug)
                util::cout << "s_b_mfm_fm " << bitbuf.encoding << " DAM (am=" << am << ") at offset " << am_offset << " (" << bitbuf.track_offset(am_offset) << ")\n";
            data_fields.push_back(std::make_pair(am_offset, bitbuf.encoding));
            break;
        }

        case 0xfc:  // IAM
            if (opt.debug)
                util::cout << "s_b_mfm_fm " << bitbuf.encoding << " IAM at offset " << am_offset << " (" << bitbuf.track_offset(am_offset) << ")\n";
            break;

        default:
            if (opt.debug)
                util::cout << "s_b_mfm_fm unknown " << bitbuf.encoding << " AM (" << std::hex << am << std::dec << ") at offset " << am_offset << " on " << trackdata.cylhead << "\n";
            break;
        }
    }

    // Process each sector header to look for an associated data field
    for (auto it = track.begin(); it != track.end(); ++it)
    {
        auto& sector = *it;
        auto final_sector = std::next(it) == track.end();

        auto shift = (sector.encoding == Encoding::FM) ? 5 : 4;
        auto gap2_size = (sector.datarate == DataRate::_1M) ? GAP2_MFM_ED : GAP2_MFM_DDHD;  // gap2 size in MFM bytes (FM is half size but double encoding overhead)
        auto min_distance = ((1 + 6) << shift) + (gap2_size << 4);          // AM, ID, gap2 (fixed shift as FM is half size)
        auto max_distance = ((1 + 6) << shift) + ((23 + gap2_size) << 4);       // 1=AM, 6=ID, 21+gap2=max WD177x offset (gap2 may be longer when formatted by different type of controller)

        // If the header has a CRC error, the data can't be reached
        if (sector.has_badidcrc())
            continue;

        if (opt.debug)
            util::cout << "  s_b_mfm_fm finding " << trackdata.cylhead << " sector " << sector.header.sector << ":\n";

        for (auto itData = data_fields.begin(); itData != data_fields.end(); ++itData)
        {
            const auto& dam_offset = itData->first;
            const Encoding& data_encoding = itData->second;
            auto itDataNext = (std::next(itData) == data_fields.end()) ? data_fields.begin() : std::next(itData);

            // Data field must be the same encoding type
            if (data_encoding != sector.encoding)
                continue;

            // Determine distance from header to data field, taking care of track wrapping
            auto dam_track_offset = bitbuf.track_offset(dam_offset);
            auto distance = ((dam_track_offset < sector.offset) ? track.tracklen : 0) + dam_track_offset - sector.offset;

            // Reject if the data field is too close or too far away
            if (distance < min_distance || distance > max_distance)
                continue;

            bitbuf.seek(dam_offset);
            bitbuf.encoding = data_encoding;

            auto dam = bitbuf.read_byte();
            crc.init((data_encoding == Encoding::MFM) ? CRC16::A1A1A1 : CRC16::INIT_CRC);
            crc.add(dam);

            // RX02 modified MFM uses an FM DAM followed by MFM data and CRC.
            if (data_encoding == Encoding::FM && dam == 0xfd)
            {
                // Convert the sector to RX02, its size to match the data.
                sector.encoding = Encoding::RX02;
                ++sector.header.size;

                // Switch to decoding the data as MFM.
                bitbuf.encoding = Encoding::MFM;
                shift = 4;
            }

            // Determine the offset and distance to the next IDAM, taking care of track wrap if it's the final sector
            auto next_idam_offset = final_sector ? track.begin()->offset : std::next(it)->offset;
            auto next_idam_distance = ((next_idam_offset <= dam_track_offset) ? track.tracklen : 0) + next_idam_offset - dam_track_offset;
            auto next_idam_bytes = (next_idam_distance >> shift) - 1;   // -1 due to DAM being read above
            auto next_idam_align = next_idam_distance & ((1 << shift) - 1);

            // Determine the bit offset and distance to the next DAM
            auto next_dam_offset = itDataNext->first;
            auto next_dam_distance = ((next_dam_offset <= dam_offset) ? bitbuf.size() : 0) + next_dam_offset - dam_offset;
            auto next_dam_bytes = (next_dam_distance >> shift) - 1;     // -1 due to DAM being read above

            // Attempt to read gap2 from non-final sectors, unless we're asked not to
            auto read_gap2 = !final_sector && (opt.gap2 != 0);

            // Calculate the extent of the current data field, up to the next header or data field (depending if gap2 is required)
            auto extent_bytes = read_gap2 ? next_dam_bytes : next_idam_bytes;
            if (extent_bytes >= 3 && sector.encoding == Encoding::MFM) extent_bytes -= 3;   // remove A1A1A1

            auto normal_bytes = sector.size() + 2;                  // data size + CRC bytes
            auto data_bytes = std::max(normal_bytes, extent_bytes); // data size needed to check CRC

            // Calculate bytes remaining in the data in current data encoding
            auto avail_bytes = bitbuf.remaining() >> shift;

            // Ignore truncated copies, unless it's the only copy we have
            if (avail_bytes < normal_bytes)
            {
                // If we've already got a copy, ignore the truncated version
                if (sector.copies() && (!sector.is_8k_sector() || avail_bytes < 0x1802))    // ToDo: fix nasty check
                {
                    if (opt.debug)
                        util::cout << "  s_b_mfm_fm ignoring truncated sector copy\n";
                    continue;
                }

                if (opt.debug)
                    util::cout << "  s_b_mfm_fm using truncated sector data as only copy\n";
            }

            // Read the full data field and check its CRC
            Data data(data_bytes);
            bitbuf.read(data);
            bool bad_crc = crc.add(data.data(), normal_bytes) != 0;
            if (opt.debug && bad_crc)
            {
                util::cout << util::fmt("  s_b_mfm_fm bad data CRC: %02X %02X, expected %02X %02X\n",
                    data[sector.size()], data[sector.size() + 1], crc.msb(), crc.lsb());
            }

            // Truncate at the extent size, unless we're asked to keep overlapping sectors
            if (!opt.keepoverlap && extent_bytes < sector.size())
                data.resize(extent_bytes);
            else if (data.size() > sector.size() && (opt.gaps == GAPS_NONE || (opt.gap4b == 0 && final_sector)))
                data.resize(sector.size());

            auto gap2_offset = next_idam_bytes + 1 + 4 + 2;
            auto has_gap2 = data.size() >= gap2_offset;
            auto has_gap3_4b = data.size() >= normal_bytes;
            auto remove_gap2 = false;
            auto remove_gap3_4b = false;

            // Check IDAM bit alignment and value, as AnglaisCollege\track00.0.raw has rogue FE junk on cyls 22+26
            if (has_gap2)
                remove_gap2 = next_idam_align != 0 || data[next_idam_bytes] != 0xfe || test_remove_gap2(data, gap2_offset);

            if (has_gap3_4b)
            {
                if (final_sector)
                    remove_gap3_4b = test_remove_gap4b(data, normal_bytes);
                else
                    remove_gap3_4b = test_remove_gap3(data, normal_bytes, sector.gap3);
            }

            if (opt.gaps != GAPS_ALL)
            {
                if (has_gap2 && remove_gap2)
                {
                    if (opt.debug)
                        util::cout << "  s_b_mfm_fm removing gap2 data\n";
                    data.resize(next_idam_bytes - ((sector.encoding == Encoding::MFM) ? 3 : 0));
                }
                else if (has_gap2)
                {
                    if (opt.debug)
                        util::cout << "  s_b_mfm_fm skipping gap2 removal\n";
                }

                if (has_gap3_4b && remove_gap3_4b && (!has_gap2 || remove_gap2))
                {
                    if (!final_sector)
                    {
                        if (opt.debug)
                            util::cout << "  s_b_mfm_fm removing gap3 data\n";
                        data.resize(sector.size());
                    }
                    else
                    {
                        if (opt.debug)
                            util::cout << "  s_b_mfm_fm removing gap4b data\n";
                        data.resize(sector.size());
                    }
                }
            }

            // If it's an 8K sector, attempt to validate any embedded checksum
            std::set<ChecksumType> chk8k_methods;
            if (sector.is_8k_sector())
            {
                chk8k_methods = ChecksumMethods(data.data(), data.size());
                if (opt.debug)
                    util::cout << "  s_b_mfm_fm chk8k_method = " << ChecksumName(chk8k_methods) << '\n';
            }

            // Consider good sectors overhanging the index
            if (final_sector && !bad_crc)
            {
                auto splice_offset = bitbuf.track_offset(dam_offset + (normal_bytes << shift));
                if (splice_offset < dam_offset)
                    bitbuf.splicepos(std::max(splice_offset, bitbuf.splicepos()));
            }

            sector.add(std::move(data), bad_crc, dam);

            // If the data is good there's no need to search for more data fields
            if (!bad_crc || !chk8k_methods.empty())
                break;
        }
    }

    trackdata.add(std::move(track));
}